

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O0

Token front::word::get_token(string *buf)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    local_4 = CONSTTK;
  }
  else {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    if (bVar1) {
      local_4 = INTTK;
    }
    else {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
      if (bVar1) {
        local_4 = VOIDTK;
      }
      else {
        bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
        if (bVar1) {
          local_4 = IFTK;
        }
        else {
          bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
          if (bVar1) {
            local_4 = ELSETK;
          }
          else {
            bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
            if (bVar1) {
              local_4 = WHILETK;
            }
            else {
              bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
              if (bVar1) {
                local_4 = BREAK;
              }
              else {
                bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                if (bVar1) {
                  local_4 = CONTINUETK;
                }
                else {
                  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
                  if (bVar1) {
                    local_4 = RETURNTK;
                  }
                  else {
                    local_4 = IDENFR;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

Token front::word::get_token(const string &buf) {
  if (buf == "const") {
    return Token::CONSTTK;
  } else if (buf == "int") {
    return Token::INTTK;
  } else if (buf == "void") {
    return Token::VOIDTK;
  } else if (buf == "if") {
    return Token::IFTK;
  } else if (buf == "else") {
    return Token::ELSETK;
  } else if (buf == "while") {
    return Token::WHILETK;
  } else if (buf == "break") {
    return Token::BREAK;
  } else if (buf == "continue") {
    return Token::CONTINUETK;
  } else if (buf == "return") {
    return Token::RETURNTK;
  } else {
    return Token::IDENFR;
  }
}